

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogStream.h
# Opt level: O0

LogStream * __thiscall LogStream::operator<<(LogStream *this,string *v)

{
  char *len;
  FixedBuffer<4000> *in_RSI;
  LogStream *in_RDI;
  
  len = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x11382a);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::size
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI);
  FixedBuffer<4000>::append(in_RSI,(char *)in_RDI,(size_t)len);
  return in_RDI;
}

Assistant:

LogStream& operator<<(const std::string& v){
        buffer_.append(v.c_str(), v.size());
        return *this;
    }